

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::StyleColorsClassic(ImGuiStyle *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  if (dst == (ImGuiStyle *)0x0) {
    dst = GetStyle();
  }
  *(undefined8 *)dst->Colors = 0x3f6666663f666666;
  dst->Colors[0].z = 0.9;
  dst->Colors[0].w = 1.0;
  dst->Colors[1].x = 0.6;
  dst->Colors[1].y = 0.6;
  dst->Colors[1].z = 0.6;
  dst->Colors[1].w = 1.0;
  dst->Colors[2].x = 0.0;
  dst->Colors[2].y = 0.0;
  dst->Colors[2].z = 0.0;
  dst->Colors[2].w = 0.85;
  dst->Colors[3].x = 0.0;
  dst->Colors[3].y = 0.0;
  dst->Colors[3].z = 0.0;
  dst->Colors[3].w = 0.0;
  dst->Colors[4].x = 0.11;
  dst->Colors[4].y = 0.11;
  dst->Colors[4].z = 0.14;
  dst->Colors[4].w = 0.92;
  dst->Colors[5].x = 0.5;
  dst->Colors[5].y = 0.5;
  dst->Colors[5].z = 0.5;
  dst->Colors[5].w = 0.5;
  dst->Colors[6].x = 0.0;
  dst->Colors[6].y = 0.0;
  dst->Colors[6].z = 0.0;
  dst->Colors[6].w = 0.0;
  dst->Colors[7].x = 0.43;
  dst->Colors[7].y = 0.43;
  dst->Colors[7].z = 0.43;
  dst->Colors[7].w = 0.39;
  dst->Colors[8].x = 0.47;
  dst->Colors[8].y = 0.47;
  dst->Colors[8].z = 0.69;
  dst->Colors[8].w = 0.4;
  dst->Colors[9].x = 0.42;
  dst->Colors[9].y = 0.41;
  dst->Colors[9].z = 0.64;
  dst->Colors[9].w = 0.69;
  dst->Colors[10].x = 0.27;
  dst->Colors[10].y = 0.27;
  dst->Colors[10].z = 0.54;
  dst->Colors[10].w = 0.83;
  dst->Colors[0xb].x = 0.32;
  dst->Colors[0xb].y = 0.32;
  dst->Colors[0xb].z = 0.63;
  dst->Colors[0xb].w = 0.87;
  dst->Colors[0xc].x = 0.4;
  dst->Colors[0xc].y = 0.4;
  dst->Colors[0xc].z = 0.8;
  dst->Colors[0xc].w = 0.2;
  dst->Colors[0xd].x = 0.4;
  dst->Colors[0xd].y = 0.4;
  dst->Colors[0xd].z = 0.55;
  dst->Colors[0xd].w = 0.8;
  dst->Colors[0xe].x = 0.2;
  dst->Colors[0xe].y = 0.25;
  dst->Colors[0xe].z = 0.3;
  dst->Colors[0xe].w = 0.6;
  dst->Colors[0xf].x = 0.4;
  dst->Colors[0xf].y = 0.4;
  dst->Colors[0xf].z = 0.8;
  dst->Colors[0xf].w = 0.3;
  dst->Colors[0x10].x = 0.4;
  dst->Colors[0x10].y = 0.4;
  dst->Colors[0x10].z = 0.8;
  dst->Colors[0x10].w = 0.4;
  dst->Colors[0x11].x = 0.41;
  dst->Colors[0x11].y = 0.39;
  dst->Colors[0x11].z = 0.8;
  dst->Colors[0x11].w = 0.6;
  *(undefined8 *)(dst->Colors + 0x12) = 0x3f6666663f666666;
  dst->Colors[0x12].z = 0.9;
  dst->Colors[0x12].w = 0.5;
  dst->Colors[0x13].x = 1.0;
  dst->Colors[0x13].y = 1.0;
  dst->Colors[0x13].z = 1.0;
  dst->Colors[0x13].w = 0.3;
  dst->Colors[0x14].x = 0.41;
  dst->Colors[0x14].y = 0.39;
  dst->Colors[0x14].z = 0.8;
  dst->Colors[0x14].w = 0.6;
  dst->Colors[0x15].x = 0.35;
  dst->Colors[0x15].y = 0.4;
  dst->Colors[0x15].z = 0.61;
  dst->Colors[0x15].w = 0.62;
  dst->Colors[0x16].x = 0.4;
  dst->Colors[0x16].y = 0.48;
  dst->Colors[0x16].z = 0.71;
  dst->Colors[0x16].w = 0.79;
  dst->Colors[0x17].x = 0.46;
  dst->Colors[0x17].y = 0.54;
  dst->Colors[0x17].z = 0.8;
  dst->Colors[0x17].w = 1.0;
  dst->Colors[0x18].x = 0.4;
  dst->Colors[0x18].y = 0.4;
  dst->Colors[0x18].z = 0.9;
  dst->Colors[0x18].w = 0.45;
  dst->Colors[0x19].x = 0.45;
  dst->Colors[0x19].y = 0.45;
  dst->Colors[0x19].z = 0.9;
  dst->Colors[0x19].w = 0.8;
  dst->Colors[0x1a].x = 0.53;
  dst->Colors[0x1a].y = 0.53;
  dst->Colors[0x1a].z = 0.87;
  dst->Colors[0x1a].w = 0.8;
  dst->Colors[0x1b].x = 0.5;
  dst->Colors[0x1b].y = 0.5;
  dst->Colors[0x1b].z = 0.5;
  dst->Colors[0x1b].w = 0.6;
  dst->Colors[0x1c].x = 0.6;
  dst->Colors[0x1c].y = 0.6;
  dst->Colors[0x1c].z = 0.7;
  dst->Colors[0x1c].w = 1.0;
  *(undefined8 *)(dst->Colors + 0x1d) = 0x3f3333333f333333;
  dst->Colors[0x1d].z = 0.9;
  dst->Colors[0x1d].w = 1.0;
  dst->Colors[0x1e].x = 1.0;
  dst->Colors[0x1e].y = 1.0;
  dst->Colors[0x1e].z = 1.0;
  dst->Colors[0x1e].w = 0.1;
  dst->Colors[0x1f].x = 0.78;
  dst->Colors[0x1f].y = 0.82;
  dst->Colors[0x1f].z = 1.0;
  dst->Colors[0x1f].w = 0.6;
  dst->Colors[0x20].x = 0.78;
  dst->Colors[0x20].y = 0.82;
  dst->Colors[0x20].z = 1.0;
  dst->Colors[0x20].w = 0.9;
  dst->Colors[0x21].x = 0.336;
  dst->Colors[0x21].y = 0.336;
  dst->Colors[0x21].z = 0.684;
  dst->Colors[0x21].w = 0.786;
  fVar1 = dst->Colors[0x19].y;
  fVar2 = dst->Colors[0x19].z;
  fVar3 = dst->Colors[0x19].w;
  dst->Colors[0x22].x = dst->Colors[0x19].x;
  dst->Colors[0x22].y = fVar1;
  dst->Colors[0x22].z = fVar2;
  dst->Colors[0x22].w = fVar3;
  dst->Colors[0x23].x = 0.40399998;
  dst->Colors[0x23].y = 0.40399998;
  dst->Colors[0x23].z = 0.726;
  dst->Colors[0x23].w = 0.842;
  dst->Colors[0x24].x = 0.2832;
  dst->Colors[0x24].y = 0.2832;
  dst->Colors[0x24].z = 0.56880003;
  dst->Colors[0x24].w = 0.8212;
  dst->Colors[0x25].x = 0.3504;
  dst->Colors[0x25].y = 0.3504;
  dst->Colors[0x25].z = 0.6516;
  dst->Colors[0x25].w = 0.8372;
  dst->Colors[0x26].x = 1.0;
  dst->Colors[0x26].y = 1.0;
  dst->Colors[0x26].z = 1.0;
  dst->Colors[0x26].w = 1.0;
  *(undefined8 *)(dst->Colors + 0x27) = 0x3f3333333f666666;
  dst->Colors[0x27].z = 0.0;
  dst->Colors[0x27].w = 1.0;
  *(undefined8 *)(dst->Colors + 0x28) = 0x3f3333333f666666;
  dst->Colors[0x28].z = 0.0;
  dst->Colors[0x28].w = 1.0;
  dst->Colors[0x29].x = 1.0;
  dst->Colors[0x29].y = 0.6;
  dst->Colors[0x29].z = 0.0;
  dst->Colors[0x29].w = 1.0;
  dst->Colors[0x2a].x = 0.27;
  dst->Colors[0x2a].y = 0.27;
  dst->Colors[0x2a].z = 0.38;
  dst->Colors[0x2a].w = 1.0;
  dst->Colors[0x2b].x = 0.31;
  dst->Colors[0x2b].y = 0.31;
  dst->Colors[0x2b].z = 0.45;
  dst->Colors[0x2b].w = 1.0;
  dst->Colors[0x2c].x = 0.26;
  dst->Colors[0x2c].y = 0.26;
  dst->Colors[0x2c].z = 0.28;
  dst->Colors[0x2c].w = 1.0;
  dst->Colors[0x2d].x = 0.0;
  dst->Colors[0x2d].y = 0.0;
  dst->Colors[0x2d].z = 0.0;
  dst->Colors[0x2d].w = 0.0;
  dst->Colors[0x2e].x = 1.0;
  dst->Colors[0x2e].y = 1.0;
  dst->Colors[0x2e].z = 1.0;
  dst->Colors[0x2e].w = 0.07;
  dst->Colors[0x2f].x = 0.0;
  dst->Colors[0x2f].y = 0.0;
  dst->Colors[0x2f].z = 1.0;
  dst->Colors[0x2f].w = 0.35;
  dst->Colors[0x30].x = 1.0;
  dst->Colors[0x30].y = 1.0;
  dst->Colors[0x30].z = 0.0;
  dst->Colors[0x30].w = 0.9;
  fVar1 = dst->Colors[0x19].y;
  fVar2 = dst->Colors[0x19].z;
  fVar3 = dst->Colors[0x19].w;
  dst->Colors[0x31].x = dst->Colors[0x19].x;
  dst->Colors[0x31].y = fVar1;
  dst->Colors[0x31].z = fVar2;
  dst->Colors[0x31].w = fVar3;
  dst->Colors[0x32].x = 1.0;
  dst->Colors[0x32].y = 1.0;
  dst->Colors[0x32].z = 1.0;
  dst->Colors[0x32].w = 0.7;
  dst->Colors[0x33].x = 0.8;
  dst->Colors[0x33].y = 0.8;
  dst->Colors[0x33].z = 0.8;
  dst->Colors[0x33].w = 0.2;
  dst->Colors[0x34].x = 0.2;
  dst->Colors[0x34].y = 0.2;
  dst->Colors[0x34].z = 0.2;
  dst->Colors[0x34].w = 0.35;
  return;
}

Assistant:

void ImGui::StyleColorsClassic(ImGuiStyle* dst)
{
    ImGuiStyle* style = dst ? dst : &ImGui::GetStyle();
    ImVec4* colors = style->Colors;

    colors[ImGuiCol_Text]                   = ImVec4(0.90f, 0.90f, 0.90f, 1.00f);
    colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
    colors[ImGuiCol_WindowBg]               = ImVec4(0.00f, 0.00f, 0.00f, 0.85f);
    colors[ImGuiCol_ChildBg]                = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    colors[ImGuiCol_PopupBg]                = ImVec4(0.11f, 0.11f, 0.14f, 0.92f);
    colors[ImGuiCol_Border]                 = ImVec4(0.50f, 0.50f, 0.50f, 0.50f);
    colors[ImGuiCol_BorderShadow]           = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    colors[ImGuiCol_FrameBg]                = ImVec4(0.43f, 0.43f, 0.43f, 0.39f);
    colors[ImGuiCol_FrameBgHovered]         = ImVec4(0.47f, 0.47f, 0.69f, 0.40f);
    colors[ImGuiCol_FrameBgActive]          = ImVec4(0.42f, 0.41f, 0.64f, 0.69f);
    colors[ImGuiCol_TitleBg]                = ImVec4(0.27f, 0.27f, 0.54f, 0.83f);
    colors[ImGuiCol_TitleBgActive]          = ImVec4(0.32f, 0.32f, 0.63f, 0.87f);
    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.40f, 0.40f, 0.80f, 0.20f);
    colors[ImGuiCol_MenuBarBg]              = ImVec4(0.40f, 0.40f, 0.55f, 0.80f);
    colors[ImGuiCol_ScrollbarBg]            = ImVec4(0.20f, 0.25f, 0.30f, 0.60f);
    colors[ImGuiCol_ScrollbarGrab]          = ImVec4(0.40f, 0.40f, 0.80f, 0.30f);
    colors[ImGuiCol_ScrollbarGrabHovered]   = ImVec4(0.40f, 0.40f, 0.80f, 0.40f);
    colors[ImGuiCol_ScrollbarGrabActive]    = ImVec4(0.41f, 0.39f, 0.80f, 0.60f);
    colors[ImGuiCol_CheckMark]              = ImVec4(0.90f, 0.90f, 0.90f, 0.50f);
    colors[ImGuiCol_SliderGrab]             = ImVec4(1.00f, 1.00f, 1.00f, 0.30f);
    colors[ImGuiCol_SliderGrabActive]       = ImVec4(0.41f, 0.39f, 0.80f, 0.60f);
    colors[ImGuiCol_Button]                 = ImVec4(0.35f, 0.40f, 0.61f, 0.62f);
    colors[ImGuiCol_ButtonHovered]          = ImVec4(0.40f, 0.48f, 0.71f, 0.79f);
    colors[ImGuiCol_ButtonActive]           = ImVec4(0.46f, 0.54f, 0.80f, 1.00f);
    colors[ImGuiCol_Header]                 = ImVec4(0.40f, 0.40f, 0.90f, 0.45f);
    colors[ImGuiCol_HeaderHovered]          = ImVec4(0.45f, 0.45f, 0.90f, 0.80f);
    colors[ImGuiCol_HeaderActive]           = ImVec4(0.53f, 0.53f, 0.87f, 0.80f);
    colors[ImGuiCol_Separator]              = ImVec4(0.50f, 0.50f, 0.50f, 0.60f);
    colors[ImGuiCol_SeparatorHovered]       = ImVec4(0.60f, 0.60f, 0.70f, 1.00f);
    colors[ImGuiCol_SeparatorActive]        = ImVec4(0.70f, 0.70f, 0.90f, 1.00f);
    colors[ImGuiCol_ResizeGrip]             = ImVec4(1.00f, 1.00f, 1.00f, 0.10f);
    colors[ImGuiCol_ResizeGripHovered]      = ImVec4(0.78f, 0.82f, 1.00f, 0.60f);
    colors[ImGuiCol_ResizeGripActive]       = ImVec4(0.78f, 0.82f, 1.00f, 0.90f);
    colors[ImGuiCol_Tab]                    = ImLerp(colors[ImGuiCol_Header],       colors[ImGuiCol_TitleBgActive], 0.80f);
    colors[ImGuiCol_TabHovered]             = colors[ImGuiCol_HeaderHovered];
    colors[ImGuiCol_TabActive]              = ImLerp(colors[ImGuiCol_HeaderActive], colors[ImGuiCol_TitleBgActive], 0.60f);
    colors[ImGuiCol_TabUnfocused]           = ImLerp(colors[ImGuiCol_Tab],          colors[ImGuiCol_TitleBg], 0.80f);
    colors[ImGuiCol_TabUnfocusedActive]     = ImLerp(colors[ImGuiCol_TabActive],    colors[ImGuiCol_TitleBg], 0.40f);
    colors[ImGuiCol_PlotLines]              = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
    colors[ImGuiCol_PlotLinesHovered]       = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
    colors[ImGuiCol_PlotHistogram]          = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
    colors[ImGuiCol_PlotHistogramHovered]   = ImVec4(1.00f, 0.60f, 0.00f, 1.00f);
    colors[ImGuiCol_TableHeaderBg]          = ImVec4(0.27f, 0.27f, 0.38f, 1.00f);
    colors[ImGuiCol_TableBorderStrong]      = ImVec4(0.31f, 0.31f, 0.45f, 1.00f);   // Prefer using Alpha=1.0 here
    colors[ImGuiCol_TableBorderLight]       = ImVec4(0.26f, 0.26f, 0.28f, 1.00f);   // Prefer using Alpha=1.0 here
    colors[ImGuiCol_TableRowBg]             = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    colors[ImGuiCol_TableRowBgAlt]          = ImVec4(1.00f, 1.00f, 1.00f, 0.07f);
    colors[ImGuiCol_TextSelectedBg]         = ImVec4(0.00f, 0.00f, 1.00f, 0.35f);
    colors[ImGuiCol_DragDropTarget]         = ImVec4(1.00f, 1.00f, 0.00f, 0.90f);
    colors[ImGuiCol_NavHighlight]           = colors[ImGuiCol_HeaderHovered];
    colors[ImGuiCol_NavWindowingHighlight]  = ImVec4(1.00f, 1.00f, 1.00f, 0.70f);
    colors[ImGuiCol_NavWindowingDimBg]      = ImVec4(0.80f, 0.80f, 0.80f, 0.20f);
    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.20f, 0.20f, 0.20f, 0.35f);
}